

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
::find_soo<google::protobuf::EnumValueDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
           *this,key_arg<const_google::protobuf::EnumValueDescriptor_*> *key)

{
  bool bVar1;
  slot_type *slot;
  EnumValueDescriptor **ts;
  iterator iVar2;
  EqualElement<const_google::protobuf::EnumValueDescriptor_*> local_38;
  key_arg<const_google::protobuf::EnumValueDescriptor_*> *local_28;
  key_arg<const_google::protobuf::EnumValueDescriptor_*> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *this_local;
  
  local_28 = key;
  key_local = (key_arg<const_google::protobuf::EnumValueDescriptor_*> *)this;
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    *)this);
  if (!bVar1) {
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = const google::protobuf::EnumValueDescriptor *]"
                 );
  }
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   *)this);
  if (!bVar1) {
    local_38.rhs = local_28;
    local_38.eq = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::eq_ref((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            *)this);
    slot = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                       *)this);
    ts = common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,void>
         ::
         element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>>
                   (slot);
    bVar1 = hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::EnumValueDescriptor_const*>>::EqualElement<google::protobuf::EnumValueDescriptor_const*>,google::protobuf::EnumValueDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::EnumValueDescriptor_const*>>
                      (&local_38,ts);
    if (bVar1) {
      iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              *)this);
      return iVar2;
    }
  }
  iVar2 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 *)this);
  return iVar2;
}

Assistant:

iterator find_soo(const key_arg<K>& key) {
    ABSL_SWISSTABLE_ASSERT(is_soo());
    return empty() || !PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                           PolicyTraits::element(soo_slot()))
               ? end()
               : soo_iterator();
  }